

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

QVariant * __thiscall
QGraphicsWidget::itemChange(QWindow *this,GraphicsItemChange change,QVariant *value)

{
  bool bVar1;
  QGraphicsWidgetPrivate *pQVar2;
  ulong uVar3;
  undefined4 in_EDX;
  QGraphicsItem *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  bool resized;
  QGraphicsWidgetPrivate *d;
  QEvent event_6;
  QEvent event_5;
  QEvent event_4;
  QEvent event_3;
  QHideEvent event_2;
  QShowEvent event_1;
  QEvent event;
  QGraphicsWidget *this_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QGraphicsWidget *)0xa4d30a);
  switch(in_EDX) {
  case 2:
    uVar3 = ::QVariant::toBool();
    if ((uVar3 & 1) != 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QShowEvent::QShowEvent((QShowEvent *)&local_28);
      QCoreApplication::sendEvent((QObject *)in_RSI,(QEvent *)&local_28);
      bVar1 = testAttribute(this_00,(WidgetAttribute)((ulong)in_RDI >> 0x20));
      if (!bVar1) {
        adjustSize((QWindow *)in_RSI);
        setAttribute((QWindow *)this_00,(WidgetAttribute)((ulong)in_RDI >> 0x20),
                     SUB81((ulong)in_RDI >> 0x18,0));
      }
      QShowEvent::~QShowEvent((QShowEvent *)&local_28);
    }
    uVar3 = ::QVariant::toBool();
    if (((uVar3 & 1) != 0) ||
       ((*(ulong *)&(pQVar2->super_QGraphicsItemPrivate).field_0x160 >> 6 & 1) != 0)) {
      (*in_RSI->_vptr_QGraphicsItem[0x15])();
    }
    break;
  default:
    break;
  case 5:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,ParentAboutToChange);
    QCoreApplication::sendEvent((QObject *)in_RSI,(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
    break;
  case 9:
    QGraphicsWidgetPrivate::setGeometryFromSetPos
              ((QGraphicsWidgetPrivate *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    break;
  case 0xc:
    uVar3 = ::QVariant::toBool();
    if ((uVar3 & 1) == 0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QHideEvent::QHideEvent((QHideEvent *)&local_38);
      QCoreApplication::sendEvent((QObject *)in_RSI,(QEvent *)&local_38);
      QHideEvent::~QHideEvent((QHideEvent *)&local_38);
    }
    break;
  case 0xd:
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,EnabledChange);
    QCoreApplication::sendEvent((QObject *)in_RSI,(QEvent *)&local_18);
    QEvent::~QEvent((QEvent *)&local_18);
    break;
  case 0xf:
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_58,ParentChange);
    QCoreApplication::sendEvent((QObject *)in_RSI,(QEvent *)&local_58);
    QEvent::~QEvent((QEvent *)&local_58);
    break;
  case 0x12:
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,CursorChange);
    QCoreApplication::sendEvent((QObject *)in_RSI,(QEvent *)&local_68);
    QEvent::~QEvent((QEvent *)&local_68);
    break;
  case 0x14:
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_78,ToolTipChange);
    QCoreApplication::sendEvent((QObject *)in_RSI,(QEvent *)&local_78);
    QEvent::~QEvent((QEvent *)&local_78);
  }
  QGraphicsItem::itemChange(in_RSI,(GraphicsItemChange)((ulong)this_00 >> 0x20),(QVariant *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QVariant *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsWidget::itemChange(GraphicsItemChange change, const QVariant &value)
{
    Q_D(QGraphicsWidget);
    switch (change) {
    case ItemEnabledHasChanged: {
        // Send EnabledChange after the enabled state has changed.
        QEvent event(QEvent::EnabledChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemVisibleChange:
        if (value.toBool()) {
            // Send Show event before the item has been shown.
            QShowEvent event;
            QCoreApplication::sendEvent(this, &event);
            bool resized = testAttribute(Qt::WA_Resized);
            if (!resized) {
                adjustSize();
                setAttribute(Qt::WA_Resized, false);
            }
        }

        // layout size hint only changes if an item changes from/to explicitly hidden state
        if (value.toBool() || d->explicitlyHidden)
            updateGeometry();
        break;
    case ItemVisibleHasChanged:
        if (!value.toBool()) {
            // Send Hide event after the item has been hidden.
            QHideEvent event;
            QCoreApplication::sendEvent(this, &event);
        }
        break;
    case ItemPositionHasChanged:
        d->setGeometryFromSetPos();
        break;
    case ItemParentChange: {
        // Deliver ParentAboutToChange.
        QEvent event(QEvent::ParentAboutToChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemParentHasChanged: {
        // Deliver ParentChange.
        QEvent event(QEvent::ParentChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemCursorHasChanged: {
        // Deliver CursorChange.
        QEvent event(QEvent::CursorChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemToolTipHasChanged: {
        // Deliver ToolTipChange.
        QEvent event(QEvent::ToolTipChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    default:
        break;
    }
    return QGraphicsItem::itemChange(change, value);
}